

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall ClipperLib::Clipper::ProcessIntersections(Clipper *this,long64 botY,long64 topY)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->m_ActiveEdges != (TEdge *)0x0) {
    BuildIntersectList(this,botY,topY);
    if (this->m_IntersectNodes != (IntersectNode *)0x0) {
      bVar1 = FixupIntersections(this);
      if (bVar1) {
        ProcessIntersectList(this);
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool Clipper::ProcessIntersections(const long64 botY, const long64 topY)
{
  if( !m_ActiveEdges ) return true;
  try {
    BuildIntersectList(botY, topY);
    if ( !m_IntersectNodes) return true;
    if ( FixupIntersections() ) ProcessIntersectList();
    else return false;
  }
  catch(...) {
    m_SortedEdges = 0;
    DisposeIntersectNodes();
    throw clipperException("ProcessIntersections error");
  }
  return true;
}